

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

string * testing::internal::StripTrailingSpaces(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  reference pcVar2;
  bool local_51;
  undefined8 local_38;
  char *local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator it;
  string *str_local;
  
  it._M_current = (char *)str;
  local_20._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    local_28._M_current = (char *)std::__cxx11::string::begin();
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    local_51 = false;
    if (bVar1) {
      this = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator--(&local_20);
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(this);
      local_51 = IsSpace(*pcVar2);
    }
    if (local_51 == false) break;
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_38,&local_20);
    local_30 = (char *)std::__cxx11::string::erase(str,local_38);
    local_20._M_current = local_30;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StripTrailingSpaces(std::string str) {
  std::string::iterator it = str.end();
  while (it != str.begin() && IsSpace(*--it)) it = str.erase(it);
  return str;
}